

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

void __thiscall
helics::CustomMessageOperator::CustomMessageOperator
          (CustomMessageOperator *this,
          function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
          *userMessageFunction)

{
  function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  *in_RDI;
  function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  *in_stack_ffffffffffffffd8;
  
  FilterOperator::FilterOperator((FilterOperator *)in_RDI);
  *(undefined ***)&(in_RDI->super__Function_base)._M_functor = &PTR__CustomMessageOperator_00a3fca8;
  std::
  function<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_(std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
  ::function(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

CustomMessageOperator::CustomMessageOperator(
    std::function<std::unique_ptr<Message>(std::unique_ptr<Message>)> userMessageFunction):
    messageFunction(std::move(userMessageFunction))
{
}